

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::PrimSpec::MoveFrom(PrimSpec *this,PrimSpec *rhs)

{
  this->_specifier = rhs->_specifier;
  ::std::__cxx11::string::operator=((string *)&this->_typeName,(string *)&rhs->_typeName);
  ::std::__cxx11::string::operator=((string *)&this->_name,(string *)&rhs->_name);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::_M_move_assign
            (&this->_children,&rhs->_children);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=(&this->_props,&rhs->_props);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->_current_vsmap,&rhs->_current_vsmap);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::operator=(&this->_variantSets,&rhs->_variantSets);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_move_assign
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_primChildren,
             &rhs->_primChildren);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_move_assign
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_properties,
             &rhs->_properties);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_move_assign
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_variantChildren,
             &rhs->_variantChildren);
  PrimMetas::operator=(&this->_metas,&rhs->_metas);
  ::std::__cxx11::string::_M_assign((string *)&this->_current_working_path);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->_asset_search_paths,&rhs->_asset_search_paths);
  return;
}

Assistant:

void MoveFrom(PrimSpec &rhs) {
    _specifier = std::move(rhs._specifier);
    _typeName = std::move(rhs._typeName);
    _name = std::move(rhs._name);

    _children = std::move(rhs._children);

    _props = std::move(rhs._props);

    //_vsmap = std::move(rhs._vsmap);
    _current_vsmap = std::move(rhs._current_vsmap);

    _variantSets = std::move(rhs._variantSets);

    _primChildren = std::move(rhs._primChildren);
    _properties = std::move(rhs._properties);
    _variantChildren = std::move(rhs._variantChildren);

    _metas = std::move(rhs._metas);

    _current_working_path = rhs._current_working_path;
    _asset_search_paths = std::move(rhs._asset_search_paths);
  }